

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

RuntimeFunction * __thiscall
Js::JavascriptLibrary::CreateBuiltinConstructor
          (JavascriptLibrary *this,FunctionInfo *functionInfo,DynamicTypeHandler *typeHandler,
          DynamicObject *prototype)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  JavascriptMethod entryPoint;
  DynamicType *type;
  Recycler *recycler;
  RuntimeFunction *this_00;
  undefined1 local_68 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  TVar3 = functionInfo->attributes;
  if ((TVar3 & ErrorOnNew) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x12bb,
                                "((functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                ,
                                "(functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    TVar3 = functionInfo->attributes;
  }
  if (prototype == (DynamicObject *)0x0) {
    prototype = (this->super_JavascriptLibraryBase).functionPrototype.ptr;
  }
  if ((TVar3 & SkipDefaultNewObject) == None) {
    data._32_8_ = &ConstructorCache::DefaultInstance;
  }
  else {
    data._32_8_ = (this->builtInConstructorCache).ptr;
  }
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  entryPoint = FunctionInfo::GetOriginalEntryPoint(functionInfo);
  type = DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                          entryPoint,typeHandler,false,false);
  local_68 = (undefined1  [8])&RuntimeFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x12c7;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  this_00 = (RuntimeFunction *)new<(Memory::ObjectInfoBits)1>(0x40,recycler,&local_31);
  RuntimeFunction::RuntimeFunction(this_00,type,functionInfo,(ConstructorCache *)data._32_8_);
  return this_00;
}

Assistant:

RuntimeFunction* JavascriptLibrary::CreateBuiltinConstructor(FunctionInfo * functionInfo, DynamicTypeHandler * typeHandler, DynamicObject* prototype)
    {
        Assert((functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0);

        if (prototype == nullptr)
        {
            prototype = functionPrototype;
        }

        ConstructorCache* ctorCache = ((functionInfo->GetAttributes() & FunctionInfo::Attributes::SkipDefaultNewObject) != 0) ?
            static_cast<ConstructorCache*>(this->builtInConstructorCache) : &ConstructorCache::DefaultInstance;

        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, prototype, functionInfo->GetOriginalEntryPoint(), typeHandler);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, RuntimeFunction, type, functionInfo, ctorCache);
    }